

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O1

int uv_pipe_bind(uv_pipe_t *handle,char *name)

{
  int __fd;
  int iVar1;
  char *__src;
  int *piVar2;
  int iVar3;
  sockaddr_un saddr;
  sockaddr local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined6 uStack_40;
  undefined2 local_3a;
  undefined6 uStack_38;
  ulong uStack_32;
  
  iVar1 = -0x16;
  if ((handle->io_watcher).fd < 0) {
    __src = strdup(name);
    iVar3 = -1;
    if (__src == (char *)0x0) {
      iVar1 = -0xc;
    }
    else {
      __fd = uv__socket(1,1,0);
      iVar1 = __fd;
      if (-1 < __fd) {
        uStack_38 = 0;
        uStack_32 = 0;
        uStack_48 = 0;
        uStack_40 = 0;
        local_3a = 0;
        local_58 = 0;
        uStack_50 = 0;
        local_68 = 0;
        uStack_60 = 0;
        local_78 = 0;
        uStack_70 = 0;
        local_88 = 0;
        uStack_80 = 0;
        local_98.sa_family = 0;
        local_98.sa_data[0] = '\0';
        local_98.sa_data[1] = '\0';
        local_98.sa_data[2] = '\0';
        local_98.sa_data[3] = '\0';
        local_98.sa_data[4] = '\0';
        local_98.sa_data[5] = '\0';
        local_98.sa_data[6] = '\0';
        local_98.sa_data[7] = '\0';
        local_98.sa_data[8] = '\0';
        local_98.sa_data[9] = '\0';
        local_98.sa_data[10] = '\0';
        local_98.sa_data[0xb] = '\0';
        local_98.sa_data[0xc] = '\0';
        local_98.sa_data[0xd] = '\0';
        strncpy(local_98.sa_data,__src,0x6b);
        uStack_32 = uStack_32 & 0xffffffffffffff;
        local_98.sa_family = 1;
        iVar1 = bind(__fd,&local_98,0x6e);
        if (iVar1 == 0) {
          handle->pipe_fname = __src;
          (handle->io_watcher).fd = __fd;
          return 0;
        }
        piVar2 = __errno_location();
        iVar1 = -0xd;
        iVar3 = __fd;
        if (*piVar2 != 2) {
          iVar1 = -*piVar2;
        }
      }
    }
    uv__close(iVar3);
    free(__src);
  }
  return iVar1;
}

Assistant:

int uv_pipe_bind(uv_pipe_t* handle, const char* name) {
  struct sockaddr_un saddr;
  const char* pipe_fname;
  int sockfd;
  int bound;
  int err;

  pipe_fname = NULL;
  sockfd = -1;
  bound = 0;
  err = -EINVAL;

  /* Already bound? */
  if (uv__stream_fd(handle) >= 0)
    return -EINVAL;

  /* Make a copy of the file name, it outlives this function's scope. */
  pipe_fname = strdup(name);
  if (pipe_fname == NULL) {
    err = -ENOMEM;
    goto out;
  }

  /* We've got a copy, don't touch the original any more. */
  name = NULL;

  err = uv__socket(AF_UNIX, SOCK_STREAM, 0);
  if (err < 0)
    goto out;
  sockfd = err;

  memset(&saddr, 0, sizeof saddr);
  strncpy(saddr.sun_path, pipe_fname, sizeof(saddr.sun_path) - 1);
  saddr.sun_path[sizeof(saddr.sun_path) - 1] = '\0';
  saddr.sun_family = AF_UNIX;

  if (bind(sockfd, (struct sockaddr*)&saddr, sizeof saddr)) {
    err = -errno;
    /* Convert ENOENT to EACCES for compatibility with Windows. */
    if (err == -ENOENT)
      err = -EACCES;
    goto out;
  }
  bound = 1;

  /* Success. */
  handle->pipe_fname = pipe_fname; /* Is a strdup'ed copy. */
  handle->io_watcher.fd = sockfd;
  return 0;

out:
  if (bound) {
    /* unlink() before uv__close() to avoid races. */
    assert(pipe_fname != NULL);
    unlink(pipe_fname);
  }
  uv__close(sockfd);
  free((void*)pipe_fname);
  return err;
}